

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall FIX::Parser::extractLength(Parser *this,int *length,size_type *pos,string *buffer)

{
  int iVar1;
  long lVar2;
  MessageParseError *this_00;
  FieldConvertError *anon_var_0;
  string local_90;
  undefined1 local_60 [8];
  string strLength;
  size_type endPos;
  size_type startPos;
  string *buffer_local;
  size_type *pos_local;
  int *length_local;
  Parser *this_local;
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    lVar2 = std::__cxx11::string::find((char *)buffer,0x2dd039);
    if (lVar2 == -1) {
      this_local._7_1_ = false;
    }
    else {
      strLength.field_2._8_8_ = std::__cxx11::string::find((char *)buffer,0x2dd03d);
      if (strLength.field_2._8_8_ == -1) {
        this_local._7_1_ = false;
      }
      else {
        std::__cxx11::string::string
                  ((string *)local_60,(string *)buffer,lVar2 + 3U,
                   strLength.field_2._8_8_ - (lVar2 + 3U));
        iVar1 = IntTConvertor<int>::convert((string *)local_60);
        *length = iVar1;
        if (*length < 0) {
          anon_var_0._6_1_ = 1;
          this_00 = (MessageParseError *)__cxa_allocate_exception(0x50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"",(allocator<char> *)((long)&anon_var_0 + 7));
          MessageParseError::MessageParseError(this_00,&local_90);
          anon_var_0._6_1_ = 0;
          __cxa_throw(this_00,&MessageParseError::typeinfo,MessageParseError::~MessageParseError);
        }
        *pos = strLength.field_2._8_8_ + 1;
        this_local._7_1_ = true;
        std::__cxx11::string::~string((string *)local_60);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

EXCEPT(MessageParseError) {
  if (!buffer.size()) {
    return false;
  }

  std::string::size_type startPos = buffer.find("\0019=", 0);
  if (startPos == std::string::npos) {
    return false;
  }
  startPos += 3;
  std::string::size_type endPos = buffer.find("\001", startPos);
  if (endPos == std::string::npos) {
    return false;
  }

  std::string strLength(buffer, startPos, endPos - startPos);

  try {
    length = IntConvertor::convert(strLength);
    if (length < 0) {
      throw MessageParseError();
    }
  } catch (FieldConvertError &) {
    throw MessageParseError();
  }

  pos = endPos + 1;
  return true;
}